

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

double __thiscall Character::SpellCooldownTime(Character *this)

{
  World *pWVar1;
  mapped_type *this_00;
  double dVar2;
  double dVar3;
  allocator<char> local_41;
  double local_40;
  key_type local_38;
  
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SpellCastCooldown",&local_41);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,&local_38);
  local_40 = util::variant::GetFloat(this_00);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = local_40 + this->spell_fired_time;
  dVar2 = Timer::GetTime();
  dVar3 = 0.0;
  if (0.0 <= local_40 - dVar2) {
    dVar3 = local_40 - dVar2;
  }
  return dVar3;
}

Assistant:

double Character::SpellCooldownTime() const
{
	double cooldown_period = this->world->config["SpellCastCooldown"];
	double cooldown = (this->spell_fired_time + cooldown_period) - Timer::GetTime();

	if (cooldown < 0.0)
		cooldown = 0.0;

	return cooldown;
}